

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
          (RepeatedPtrFieldBase *this,void *obj)

{
  Rep *pRVar1;
  int iVar2;
  
  pRVar1 = this->rep_;
  if ((pRVar1 == (Rep *)0x0) || (iVar2 = pRVar1->allocated_size, iVar2 == this->total_size_)) {
    InternalExtend(this,1);
    pRVar1 = this->rep_;
    iVar2 = pRVar1->allocated_size;
  }
  pRVar1->allocated_size = iVar2 + 1;
  iVar2 = this->current_size_;
  this->current_size_ = iVar2 + 1;
  pRVar1->elements[iVar2] = obj;
  return obj;
}

Assistant:

void* RepeatedPtrFieldBase::AddOutOfLineHelper(void* obj) {
  if (!rep_ || rep_->allocated_size == total_size_) {
    InternalExtend(1);  // Equivalent to "Reserve(total_size_ + 1)"
  }
  ++rep_->allocated_size;
  rep_->elements[current_size_++] = obj;
  return obj;
}